

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_loclists.c
# Opt level: O1

int read_single_lle_entry
              (Dwarf_Debug dbg,Dwarf_Small *data,Dwarf_Unsigned dataoffset,Dwarf_Small *enddata,
              Dwarf_Half address_size,uint *bytes_count_out,uint *entry_kind,
              Dwarf_Unsigned *entry_operand1,Dwarf_Unsigned *entry_operand2,
              Dwarf_Unsigned *opsblocksize,Dwarf_Unsigned *opsoffset,Dwarf_Small **ops,
              Dwarf_Error *error)

{
  Dwarf_Small *pDVar1;
  bool bVar2;
  Dwarf_Unsigned DVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  Dwarf_Unsigned DVar7;
  ulong uVar8;
  Dwarf_Small *data_00;
  ulong uVar9;
  ulong local_b0;
  ulong local_a8;
  Dwarf_Unsigned lu_local;
  Dwarf_Unsigned loc_ops_overall_size;
  Dwarf_Unsigned lopsoffset;
  Dwarf_Small *lopsdata;
  Dwarf_Unsigned loc_ops_len;
  Dwarf_Small *local_78;
  Dwarf_Unsigned loc_ops_count_len;
  Dwarf_Unsigned lu_leblen;
  int local_44;
  uint *local_40;
  ulong local_38;
  
  loc_ops_overall_size = 0;
  loc_ops_count_len = 0;
  loc_ops_len = 0;
  lopsdata = (Dwarf_Small *)0x0;
  lopsoffset = 0;
  if (enddata <= data) {
    _dwarf_error_string(dbg,error,0x1d5,
                        "DW_DLE_LOCLISTS_ERROR: An lle entry begins past the end of its allowed space. Corrupt DWARF."
                       );
    return 1;
  }
  local_b0 = (ulong)*data;
  if (8 < *data) {
    if (error == (Dwarf_Error *)0x0) {
      return 1;
    }
    dwarfstring_constructor((dwarfstring_s *)&lu_leblen);
    dwarfstring_append_printf_u
              ((dwarfstring_s *)&lu_leblen,
               "DW_DLE_LOCLISTS_ERROR: The loclists entry at .debug_loclists offset 0x%x",dataoffset
              );
    dwarfstring_append_printf_u
              ((dwarfstring_s *)&lu_leblen," has code 0x%x which is unknown",local_b0);
    pcVar6 = dwarfstring_string((dwarfstring_s *)&lu_leblen);
    _dwarf_error_string(dbg,error,0x1d5,pcVar6);
    dwarfstring_destructor((dwarfstring_s *)&lu_leblen);
    return 1;
  }
  data_00 = data + 1;
  local_40 = bytes_count_out;
  local_38 = local_b0;
  switch(local_b0) {
  case 0:
    uVar9 = 1;
    local_a8 = local_b0;
    break;
  case 1:
    lu_leblen = 0;
    lu_local = 0;
    iVar4 = dwarf_decode_leb128((char *)data_00,&lu_leblen,&lu_local,(char *)enddata);
    if (iVar4 == 1) {
      _dwarf_error_string(dbg,error,0x149,
                          "DW_DLE_LEB_IMPROPER: decode uleb w/len runs past allowed area.d");
      uVar9 = 1;
      local_a8 = 0;
    }
    else {
      data_00 = data_00 + lu_leblen;
      uVar9 = lu_leblen + 1;
      local_a8 = lu_local;
    }
    bytes_count_out = (uint *)0x1;
    if (iVar4 == 1) {
      return 1;
    }
    goto LAB_001b830b;
  default:
    lu_leblen = 0;
    lu_local = 0;
    iVar4 = dwarf_decode_leb128((char *)data_00,&lu_leblen,&lu_local,(char *)enddata);
    DVar3 = lu_leblen;
    local_a8 = lu_local;
    if (iVar4 == 1) {
      _dwarf_error_string(dbg,error,0x149,
                          "DW_DLE_LEB_IMPROPER: decode uleb w/len runs past allowed area.d");
      local_a8 = 0;
LAB_001b81b6:
      bVar2 = false;
      uVar9 = 1;
      local_b0 = 0;
    }
    else {
      data_00 = data_00 + lu_leblen;
      lu_leblen = 0;
      lu_local = 0;
      iVar4 = dwarf_decode_leb128((char *)data_00,&lu_leblen,&lu_local,(char *)enddata);
      if (iVar4 == 1) {
        _dwarf_error_string(dbg,error,0x149,
                            "DW_DLE_LEB_IMPROPER: decode uleb w/len runs past allowed area.d");
        local_b0 = 0;
        DVar7 = DVar3;
      }
      else {
        local_b0 = lu_local;
        data_00 = data_00 + lu_leblen;
        DVar7 = lu_leblen;
      }
      uVar9 = DVar3 + 1;
      if (iVar4 != 1) {
        uVar9 = uVar9 + DVar7;
LAB_001b8347:
        iVar4 = counted_loc_descr(dbg,data_00,enddata,dataoffset,&loc_ops_overall_size,
                                  &loc_ops_count_len,&loc_ops_len,&lopsdata,&lopsoffset,error);
        if (iVar4 == 0) {
          uVar9 = uVar9 + loc_ops_overall_size;
          data_00 = data_00 + loc_ops_overall_size;
          bVar2 = true;
          goto LAB_001b83a0;
        }
      }
      bVar2 = false;
    }
    goto LAB_001b83a0;
  case 5:
    uVar5 = counted_loc_descr(dbg,data_00,enddata,dataoffset,&loc_ops_overall_size,
                              &loc_ops_count_len,&loc_ops_len,&lopsdata,&lopsoffset,error);
    bytes_count_out = (uint *)(ulong)uVar5;
    uVar9 = loc_ops_overall_size + 1;
    if (uVar5 != 0) {
      return uVar5;
    }
    data_00 = data_00 + loc_ops_overall_size;
    local_a8 = 0;
LAB_001b830b:
    local_b0 = 0;
    break;
  case 6:
    lu_leblen = 0;
    uVar9 = (ulong)address_size;
    pDVar1 = data_00 + uVar9;
    if (enddata < pDVar1) {
      _dwarf_error_string(dbg,error,0x14b,
                          "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section");
      local_a8 = 0;
    }
    else {
      (*dbg->de_copy_word)(&lu_leblen,data_00,uVar9);
      local_a8 = lu_leblen;
    }
    bytes_count_out = (uint *)0x1;
    if (enddata < pDVar1) {
      return 1;
    }
    uVar9 = uVar9 + 1;
    local_b0 = 0;
    data_00 = pDVar1;
    break;
  case 7:
    lu_leblen = 0;
    uVar8 = (ulong)address_size;
    local_78 = data_00 + uVar8;
    if (enddata < local_78) {
      _dwarf_error_string(dbg,error,0x14b,
                          "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section");
      local_a8 = 0;
    }
    else {
      (*dbg->de_copy_word)(&lu_leblen,data_00,uVar8);
      local_a8 = lu_leblen;
    }
    if (enddata < local_78) goto LAB_001b81b6;
    lu_leblen = 0;
    data_00 = local_78 + uVar8;
    if (enddata < data_00) {
      _dwarf_error_string(dbg,error,0x14b,
                          "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section");
      local_b0 = 0;
    }
    else {
      (*dbg->de_copy_word)(&lu_leblen,local_78,uVar8);
      local_b0 = lu_leblen;
    }
    uVar9 = uVar8 + 1;
    if (data_00 <= enddata) {
      uVar9 = uVar9 + uVar8;
      goto LAB_001b8347;
    }
    bVar2 = false;
    data_00 = local_78;
LAB_001b83a0:
    bytes_count_out = (uint *)0x1;
    iVar4 = 1;
joined_r0x001b84ed:
    if (!bVar2) {
      return iVar4;
    }
    break;
  case 8:
    lu_leblen = 0;
    uVar9 = (ulong)address_size;
    local_78 = data_00 + uVar9;
    if (enddata < local_78) {
      _dwarf_error_string(dbg,error,0x14b,
                          "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section");
      local_a8 = 0;
    }
    else {
      (*dbg->de_copy_word)(&lu_leblen,data_00,uVar9);
      local_a8 = lu_leblen;
    }
    pDVar1 = local_78;
    bytes_count_out = (uint *)0x1;
    if (enddata < local_78) {
      bVar2 = false;
      uVar9 = 1;
      local_b0 = 0;
    }
    else {
      lu_leblen = 0;
      lu_local = 0;
      iVar4 = dwarf_decode_leb128((char *)local_78,&lu_leblen,&lu_local,(char *)enddata);
      if (iVar4 == 1) {
        local_44 = iVar4;
        _dwarf_error_string(dbg,error,0x149,
                            "DW_DLE_LEB_IMPROPER: decode uleb w/len runs past allowed area.d");
        local_b0 = 0;
        uVar8 = 0;
        data_00 = pDVar1;
        iVar4 = local_44;
      }
      else {
        local_b0 = lu_local;
        data_00 = pDVar1 + lu_leblen;
        uVar8 = lu_leblen & 0xffffffff;
      }
      uVar9 = uVar9 + 1;
      if (iVar4 == 1) {
        bVar2 = false;
      }
      else {
        uVar9 = uVar9 + uVar8;
        uVar5 = counted_loc_descr(dbg,data_00,enddata,dataoffset,&loc_ops_overall_size,
                                  &loc_ops_count_len,&loc_ops_len,&lopsdata,&lopsoffset,error);
        if (uVar5 == 0) {
          uVar9 = uVar9 + loc_ops_overall_size;
          data_00 = data_00 + loc_ops_overall_size;
          bVar2 = true;
        }
        else {
          bVar2 = false;
          bytes_count_out = (uint *)(ulong)uVar5;
        }
      }
    }
    iVar4 = (int)bytes_count_out;
    goto joined_r0x001b84ed;
  }
  iVar4 = (int)bytes_count_out;
  if (data_00 < data || enddata < data_00) {
    pcVar6 = "DW_DLE_LOCLISTS_ERROR: The end of an lle entry is past the end of its allowed space";
  }
  else {
    bVar2 = true;
    if (uVar9 <= (dbg->de_debug_loclists).dss_size) goto LAB_001b83f6;
    pcVar6 = 
    "DW_DLE_LOCLISTS_ERROR: The number of bytes in a single loclist entry is too large to be reasonable"
    ;
  }
  _dwarf_error_string(dbg,error,0x1d5,pcVar6);
  iVar4 = 1;
  bVar2 = false;
LAB_001b83f6:
  if (bVar2) {
    *local_40 = (uint)uVar9;
    *entry_kind = (uint)local_38;
    *entry_operand1 = local_a8;
    *entry_operand2 = local_b0;
    *opsblocksize = loc_ops_len;
    *opsoffset = lopsoffset;
    *ops = lopsdata;
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

static int
read_single_lle_entry(Dwarf_Debug dbg,
    Dwarf_Small    *data,
    Dwarf_Unsigned  dataoffset,
    Dwarf_Small    *enddata,
    Dwarf_Half      address_size,
    unsigned       *bytes_count_out,
    unsigned       *entry_kind,
    Dwarf_Unsigned *entry_operand1,
    Dwarf_Unsigned *entry_operand2,
    Dwarf_Unsigned *opsblocksize, /* Just the  expr data */
    Dwarf_Unsigned *opsoffset, /* Just the expr ops data */
    Dwarf_Small   **ops, /*  pointer to expr ops ops */
    Dwarf_Error* error)
{
    Dwarf_Unsigned count = 0;
    Dwarf_Unsigned leblen = 0;
    unsigned int   code = 0;
    Dwarf_Unsigned val1 = 0;
    Dwarf_Unsigned val2 = 0;
    Dwarf_Unsigned loc_ops_overall_size = 0;
    Dwarf_Unsigned loc_ops_count_len = 0;
    Dwarf_Unsigned loc_ops_len = 0;
    Dwarf_Small   *lopsdata = 0;
    Dwarf_Unsigned lopsoffset = 0;
    Dwarf_Small   *startdata = 0;

    /*  Some of these have a  Counted Location Description
        in them. */
    if (data >= enddata) {
        _dwarf_error_string(dbg,error,DW_DLE_LOCLISTS_ERROR,
            "DW_DLE_LOCLISTS_ERROR: "
            "An lle entry begins past the end of "
            "its allowed space. Corrupt DWARF.");
        return DW_DLV_ERROR;
    }
    startdata = data;
    code = *data;
    ++data;
    ++count;
    switch(code) {
    case DW_LLE_end_of_list: break;
    case DW_LLE_base_addressx:{
        DECODE_LEB128_UWORD_LEN_CK(data,val1,leblen,
            dbg,error,enddata);
        count += leblen;
        }
        break;
    case DW_LLE_startx_endx:
    case DW_LLE_startx_length:
    case DW_LLE_offset_pair: {
        int res = 0;

        DECODE_LEB128_UWORD_LEN_CK(data,val1,leblen,
            dbg,error,enddata);
        count += leblen;
        DECODE_LEB128_UWORD_LEN_CK(data,val2,leblen,
            dbg,error,enddata);
        count += leblen;
        res = counted_loc_descr(dbg,data,enddata,
            dataoffset,
            &loc_ops_overall_size,
            &loc_ops_count_len,
            &loc_ops_len,
            &lopsdata,
            &lopsoffset,
            error);
        if (res != DW_DLV_OK) {
            return res;
        }
        count += loc_ops_overall_size;
        data  += loc_ops_overall_size;

        }
        break;
    case DW_LLE_default_location: {
        int res = 0;

        res = counted_loc_descr(dbg,data,enddata,
            dataoffset,
            &loc_ops_overall_size,
            &loc_ops_count_len,
            &loc_ops_len,
            &lopsdata,
            &lopsoffset,
            error);
        if (res != DW_DLV_OK) {
            return res;
        }
        data +=  loc_ops_overall_size;
        count +=  loc_ops_overall_size;
        }
        break;
    case DW_LLE_base_address: {
        READ_UNALIGNED_CK(dbg,val1, Dwarf_Unsigned,
            data,address_size,error,enddata);
        data += address_size;
        count += address_size;
        }
        break;
    case DW_LLE_start_end: {
        int res = 0;

        READ_UNALIGNED_CK(dbg,val1, Dwarf_Unsigned,
            data,address_size,error,enddata);
        data += address_size;
        count += address_size;
        READ_UNALIGNED_CK(dbg,val2, Dwarf_Unsigned,
            data,address_size,error,enddata);
        data += address_size;
        count += address_size;
        res = counted_loc_descr(dbg,data,enddata,
            dataoffset,
            &loc_ops_overall_size,
            &loc_ops_count_len,
            &loc_ops_len,
            &lopsdata,
            &lopsoffset,
            error);
        if (res != DW_DLV_OK) {
            return res;
        }
        count += loc_ops_overall_size;
        data +=  loc_ops_overall_size;
        }
        break;
    case DW_LLE_start_length: {
        int res = 0;

        READ_UNALIGNED_CK(dbg,val1, Dwarf_Unsigned,
            data,address_size,error,enddata);
        data += address_size;
        count += address_size;
        DECODE_LEB128_UWORD_LEN_CK(data,val2,leblen,
            dbg,error,enddata);
        count += (unsigned)leblen;
        res = counted_loc_descr(dbg,data,enddata,
            dataoffset,
            &loc_ops_overall_size,
            &loc_ops_count_len,
            &loc_ops_len,
            &lopsdata,
            &lopsoffset,
            error);
        if (res != DW_DLV_OK) {
            return res;
        }
        count += loc_ops_overall_size;
        data +=  loc_ops_overall_size;
        }
        break;
    default: {
        if (error) {
            dwarfstring m;

            dwarfstring_constructor(&m);
            dwarfstring_append_printf_u(&m,
                "DW_DLE_LOCLISTS_ERROR: "
                "The loclists entry at .debug_loclists"
                " offset 0x%x" ,dataoffset);
            dwarfstring_append_printf_u(&m,
                " has code 0x%x which is unknown",code);
            _dwarf_error_string(dbg,error,DW_DLE_LOCLISTS_ERROR,
                dwarfstring_string(&m));
            dwarfstring_destructor(&m);
        }
        return DW_DLV_ERROR;
        }
        break;
    }
    {
        /*  We want to avoid overflow in additions, and
            the overall section size is a reasonable check
            on count.  The sequence of tests is to
            preserve a testing baseline:
            baselines/hongg2024-02-18-m.base
            otherwise we would test against sectionsize first.*/
        Dwarf_Unsigned sectionsize = dbg->de_debug_loclists.dss_size;

        if (data > enddata || data < startdata ) {
            /*  Corrupt data being read. */
            _dwarf_error_string(dbg,error,DW_DLE_LOCLISTS_ERROR,
                "DW_DLE_LOCLISTS_ERROR: "
                "The end of an lle entry is past the end "
                "of its allowed space");
            return DW_DLV_ERROR;
        }
        if (count > sectionsize) {
            /*  Corrupt data being read. */
            _dwarf_error_string(dbg,error,DW_DLE_LOCLISTS_ERROR,
                "DW_DLE_LOCLISTS_ERROR: "
                "The number of bytes in a single "
                "loclist entry is "
                "too large to be reasonable");
            return DW_DLV_ERROR;
        }
    }
    *bytes_count_out = (unsigned)count;
    *entry_kind      = (unsigned)code;
    *entry_operand1  = val1;
    *entry_operand2  = val2;
    *opsblocksize    = loc_ops_len;
    *opsoffset = lopsoffset;
    *ops       = lopsdata;
    return DW_DLV_OK;
}